

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binarymodelserialiser.cpp
# Opt level: O1

bool __thiscall
BinaryModelSerialiserPrivate::readBinaryElement
          (BinaryModelSerialiserPrivate *this,QDataStream *source,QModelIndex *parent)

{
  QAbstractItemModel *pQVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  QDataStream *this_00;
  bool bVar5;
  int iVar6;
  bool hasChild;
  qint32 colCount;
  qint32 tempRole;
  qint32 rowCount;
  QVariant tempData;
  QModelIndex currIdx;
  bool local_81;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  QModelIndex *local_70;
  anon_union_24_3_e3d07ef4_for_data local_68;
  undefined8 local_50;
  QModelIndex local_48;
  
  this_00 = (QDataStream *)QDataStream::operator>>(source,&local_78);
  QDataStream::operator>>(this_00,&local_80);
  pQVar1 = (this->super_AbstractModelSerialiserPrivate).m_model;
  bVar5 = false;
  (**(code **)(*(long *)pQVar1 + 0xf8))(pQVar1,0,local_78,parent);
  pQVar1 = (this->super_AbstractModelSerialiserPrivate).m_model;
  (**(code **)(*(long *)pQVar1 + 0x100))(pQVar1,0,local_80,parent);
  pQVar1 = (this->super_AbstractModelSerialiserPrivate).m_model;
  iVar3 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,parent);
  if (iVar3 == local_78) {
    pQVar1 = (this->super_AbstractModelSerialiserPrivate).m_model;
    iVar3 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,parent);
    if (iVar3 == local_80) {
      local_7c = -1;
      local_68.shared = (PrivateShared *)0x0;
      local_68._8_8_ = 0;
      local_68._16_8_ = 0;
      local_50 = 2;
      local_81 = false;
      if (0 < local_78) {
        local_74 = 0;
        local_70 = parent;
        do {
          iVar3 = QDataStream::status();
          if (iVar3 != 0) break;
          if (0 < local_80) {
            iVar3 = 0;
            do {
              iVar4 = QDataStream::status();
              if (iVar4 != 0) break;
              pQVar1 = (this->super_AbstractModelSerialiserPrivate).m_model;
              (**(code **)(*(long *)pQVar1 + 0x60))(&local_48,pQVar1,local_74,iVar3,parent);
              QDataStream::operator>>(source,&local_7c);
              while (local_7c != -1) {
                iVar4 = QDataStream::status();
                if (iVar4 != 0) break;
                ::operator>>(source,(QVariant *)&local_68);
                iVar4 = QDataStream::status();
                if (iVar4 != 0) break;
                pQVar1 = (this->super_AbstractModelSerialiserPrivate).m_model;
                (**(code **)(*(long *)pQVar1 + 0x98))(pQVar1,&local_48,&local_68,local_7c);
                QDataStream::operator>>(source,&local_7c);
              }
              iVar4 = QDataStream::status();
              if (iVar4 == 0) {
                QDataStream::operator>>(source,&local_81);
              }
              iVar4 = QDataStream::status();
              iVar6 = 0;
              if (iVar4 == 0) {
                bVar5 = true;
                if (local_81 == true) {
                  bVar2 = readBinaryElement(this,source,&local_48);
                  if (!bVar2) {
                    pQVar1 = (this->super_AbstractModelSerialiserPrivate).m_model;
                    (**(code **)(*(long *)pQVar1 + 0x108))(pQVar1,0,local_78,local_70);
                    pQVar1 = (this->super_AbstractModelSerialiserPrivate).m_model;
                    bVar5 = false;
                    (**(code **)(*(long *)pQVar1 + 0x110))(pQVar1,0,local_80,local_70);
                    iVar6 = 1;
                  }
                }
              }
              else {
                iVar6 = 5;
                bVar5 = false;
              }
              parent = local_70;
              if (!bVar5) goto LAB_00121b4c;
              iVar3 = iVar3 + 1;
            } while (iVar3 < local_80);
            iVar6 = 5;
LAB_00121b4c:
            if (iVar6 != 5) {
              bVar5 = false;
              goto LAB_00121bac;
            }
          }
          local_74 = local_74 + 1;
        } while (local_74 < local_78);
      }
      iVar3 = QDataStream::status();
      if (iVar3 == 0) {
        bVar5 = true;
      }
      else {
        pQVar1 = (this->super_AbstractModelSerialiserPrivate).m_model;
        (**(code **)(*(long *)pQVar1 + 0x108))(pQVar1,0,local_78,parent);
        pQVar1 = (this->super_AbstractModelSerialiserPrivate).m_model;
        bVar5 = false;
        (**(code **)(*(long *)pQVar1 + 0x110))(pQVar1,0,local_80,parent);
      }
LAB_00121bac:
      ::QVariant::~QVariant((QVariant *)&local_68);
    }
    else {
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

bool BinaryModelSerialiserPrivate::readBinaryElement(QDataStream &source, const QModelIndex &parent)
{
    Q_ASSERT(m_model);
    qint32 rowCount, colCount;
    source >> rowCount >> colCount;
    m_model->insertRows(0, rowCount, parent);
    m_model->insertColumns(0, colCount, parent);
    if (m_model->rowCount(parent) != rowCount)
        return false;
    if (m_model->columnCount(parent) != colCount)
        return false;
    qint32 tempRole = -1;
    QVariant tempData;
    bool hasChild = false;
    for (int i = 0; i < rowCount && source.status() == QDataStream::Ok; ++i) {
        for (int j = 0; j < colCount && source.status() == QDataStream::Ok; ++j) {
            const QModelIndex currIdx = m_model->index(i, j, parent);
            for (source >> tempRole; tempRole != -1 && source.status() == QDataStream::Ok; source >> tempRole) {
                source >> tempData;
                if (source.status() != QDataStream::Ok)
                    break;
                m_model->setData(currIdx, tempData, tempRole);
            }
            if (source.status() == QDataStream::Ok)
                source >> hasChild;
            if (source.status() != QDataStream::Ok)
                break;
            if (hasChild) {
                if (!readBinaryElement(source, currIdx)) {
                    m_model->removeRows(0, rowCount, parent);
                    m_model->removeColumns(0, colCount, parent);
                    return false;
                }
            }
        }
    }
    if (source.status() != QDataStream::Ok) {
        m_model->removeRows(0, rowCount, parent);
        m_model->removeColumns(0, colCount, parent);
        return false;
    }
    return true;
}